

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)403>(Result *__return_storage_ptr__,Model *format)

{
  _Base_ptr *this;
  bool bVar1;
  int iVar2;
  NeuralNetworkClassifier *pNVar3;
  ModelDescription *pMVar4;
  string *psVar5;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_00;
  reference this_01;
  undefined1 in_R9B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string err_1;
  FeatureDescription *output;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  undefined1 local_f8 [8];
  string err;
  undefined1 local_c8 [8];
  string probBlob;
  undefined1 local_80 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputBlobNames;
  undefined1 local_40 [8];
  Result r;
  
  r.m_message.super__Rb_tree_node_base._M_right = (_Base_ptr)format;
  r.m_message._M_storage._M_storage = (uchar  [8])__return_storage_ptr__;
  pNVar3 = Specification::Model::neuralnetworkclassifier(format);
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::NeuralNetworkClassifier>
            ((Result *)local_40,(CoreML *)format,(Model *)pNVar3,(NeuralNetworkClassifier *)0x0,
             false,(bool)in_R9B);
  bVar1 = Result::good((Result *)local_40);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_40);
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    goto LAB_003808aa;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_80);
  pMVar4 = Specification::Model::description((Model *)r.m_message.super__Rb_tree_node_base._M_right)
  ;
  pNVar3 = Specification::Model::neuralnetworkclassifier
                     ((Model *)r.m_message.super__Rb_tree_node_base._M_right);
  bVar1 = Specification::Model::isupdatable((Model *)r.m_message.super__Rb_tree_node_base._M_right);
  validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>
            ((Result *)&probBlob.super__Rb_tree_node_base._M_right,pMVar4,pNVar3,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80,bVar1);
  this = &probBlob.super__Rb_tree_node_base._M_right;
  Result::operator=((Result *)local_40,(Result *)this);
  Result::~Result((Result *)this);
  bVar1 = Result::good((Result *)local_40);
  if (bVar1) {
    pNVar3 = Specification::Model::neuralnetworkclassifier
                       ((Model *)r.m_message.super__Rb_tree_node_base._M_right);
    psVar5 = Specification::NeuralNetworkClassifier::labelprobabilitylayername_abi_cxx11_(pNVar3);
    std::__cxx11::string::string((string *)local_c8,(string *)psVar5);
    iVar2 = std::__cxx11::string::compare(local_c8);
    if (iVar2 == 0) {
LAB_00380592:
      pMVar4 = Specification::Model::description
                         ((Model *)r.m_message.super__Rb_tree_node_base._M_right);
      this_00 = Specification::ModelDescription::output(pMVar4);
      __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                         (this_00);
      output = (FeatureDescription *)
               google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                         (this_00);
      while (bVar1 = google::protobuf::internal::
                     RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::
                     operator!=(&__end1,(iterator *)&output), bVar1) {
        this_01 = google::protobuf::internal::
                  RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                            (&__end1);
        psVar5 = Specification::FeatureDescription::name_abi_cxx11_(this_01);
        err_1._M_storage._M_storage =
             (uchar  [8])
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80,psVar5);
        err_1.super__Rb_tree_node_base._M_right =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_80);
        bVar1 = std::operator==((_Self *)&err_1._M_storage,
                                (_Self *)&err_1.super__Rb_tree_node_base._M_right);
        if (bVar1) {
          psVar5 = Specification::FeatureDescription::name_abi_cxx11_(this_01);
          pMVar4 = Specification::Model::description
                             ((Model *)r.m_message.super__Rb_tree_node_base._M_right);
          Specification::ModelDescription::predictedfeaturename_abi_cxx11_(pMVar4);
          iVar2 = std::__cxx11::string::compare((string *)psVar5);
          if (iVar2 != 0) {
            psVar5 = Specification::FeatureDescription::name_abi_cxx11_(this_01);
            pMVar4 = Specification::Model::description
                               ((Model *)r.m_message.super__Rb_tree_node_base._M_right);
            Specification::ModelDescription::predictedprobabilitiesname_abi_cxx11_(pMVar4);
            iVar2 = std::__cxx11::string::compare((string *)psVar5);
            if (iVar2 != 0) {
              psVar5 = Specification::FeatureDescription::name_abi_cxx11_(this_01);
              std::operator+(&local_188,"Output layer \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar5);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_168,&local_188,
                             "\' is not produced by any layer of the neural network.");
              std::__cxx11::string::~string((string *)&local_188);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_168);
              outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
              std::__cxx11::string::~string((string *)local_168);
              goto LAB_00380878;
            }
          }
        }
        google::protobuf::internal::
        RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end1);
      }
      Result::Result(__return_storage_ptr__,(Result *)local_40);
      outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    }
    else {
      err._M_storage._M_storage =
           (uchar  [8])
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80,(key_type *)local_c8);
      err.super__Rb_tree_node_base._M_right =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80);
      bVar1 = std::operator==((_Self *)&err._M_storage,
                              (_Self *)&err.super__Rb_tree_node_base._M_right);
      if (!bVar1) goto LAB_00380592;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     "For this neural network classifier, the probabilities are obtained from the layer \'"
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     "\' which was not found in the network.");
      std::__cxx11::string::~string((string *)&__range1);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f8);
      outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
      std::__cxx11::string::~string((string *)local_f8);
    }
LAB_00380878:
    std::__cxx11::string::~string((string *)local_c8);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_40);
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_80);
LAB_003808aa:
  Result::~Result((Result *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_neuralNetworkClassifier>(const Specification::Model& format) {
        // must have classifier parameters
        Result r = validateClassifierInterface(format, format.neuralnetworkclassifier());
        if (!r.good()) {
            return r;
        }
        
        std::set<std::string> outputBlobNames;
        r = validateNeuralNetworkTopLevel(format.description(), format.neuralnetworkclassifier(), outputBlobNames, format.isupdatable());
        
        if (!r.good()) {
            return r;
        }
        
        std::string probBlob = format.neuralnetworkclassifier().labelprobabilitylayername();
        // Check if the probability blob name was provided in the proto
        if (probBlob.compare("") != 0) {
            // Check if it corresponds to some output of the network
            if (outputBlobNames.find(probBlob) == outputBlobNames.end()) {
                std::string err = "For this neural network classifier, the probabilities are obtained from the layer '" + probBlob + "' which was not found in the network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        
        // Now, we need to check that all the model's output names are either blob names or the extra outputs
        // for a classifier
        for (const auto& output : format.description().output()) {
            // is it not an output blob?
            if (outputBlobNames.find(output.name()) == outputBlobNames.end()) {
                if (output.name().compare(format.description().predictedfeaturename()) != 0
                    && output.name().compare(format.description().predictedprobabilitiesname()) != 0) {
                    std::string err = "Output layer '" + output.name() + "' is not produced by any layer of the neural network.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
        
        return r;
        
    }